

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,deInt64 v)

{
  Value local_28;
  deInt64 local_18;
  deInt64 v_local;
  SampleBuilder *this_local;
  
  local_18 = v;
  v_local = (deInt64)this;
  Value::Value(&local_28,v);
  std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::push_back
            (&this->m_values,&local_28);
  return this;
}

Assistant:

SampleBuilder&			operator<<			(deInt64 v)	{ m_values.push_back(Value(v));				return *this; }